

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bac.h
# Opt level: O0

Bac_Man_t * Bac_ManAlloc(char *pFileName,int nNtks)

{
  int iVar1;
  Bac_Man_t *p;
  char *pcVar2;
  Abc_Nam_t *pAVar3;
  Bac_Ntk_t *pBVar4;
  Bac_Man_t *pNew;
  int i;
  Bac_Ntk_t *pNtk;
  int nNtks_local;
  char *pFileName_local;
  
  p = (Bac_Man_t *)calloc(1,0x530);
  pcVar2 = Extra_FileDesignName(pFileName);
  p->pName = pcVar2;
  pcVar2 = Abc_UtilStrsav(pFileName);
  p->pSpec = pcVar2;
  pAVar3 = Abc_NamStart(1000,0x18);
  p->pStrs = pAVar3;
  pAVar3 = Abc_NamStart(1000,0x18);
  p->pMods = pAVar3;
  p->iRoot = 1;
  p->nNtks = nNtks;
  pBVar4 = (Bac_Ntk_t *)calloc((long)(p->nNtks + 1),0xd0);
  p->pNtks = pBVar4;
  for (pNew._4_4_ = 1; iVar1 = Bac_ManNtkNum(p), pNew._4_4_ <= iVar1; pNew._4_4_ = pNew._4_4_ + 1) {
    pBVar4 = Bac_ManNtk(p,pNew._4_4_);
    pBVar4->pDesign = p;
  }
  Bac_ManSetupTypes(p->pPrimNames,p->pPrimSymbs);
  return p;
}

Assistant:

static inline Bac_Man_t * Bac_ManAlloc( char * pFileName, int nNtks )
{
    extern void Bac_ManSetupTypes( char ** pNames, char ** pSymbs );
    Bac_Ntk_t * pNtk; int i;
    Bac_Man_t * pNew = ABC_CALLOC( Bac_Man_t, 1 );
    pNew->pName = Extra_FileDesignName( pFileName );
    pNew->pSpec = Abc_UtilStrsav( pFileName );
    pNew->pStrs = Abc_NamStart( 1000, 24 );
    pNew->pMods = Abc_NamStart( 1000, 24 );
    pNew->iRoot = 1;
    pNew->nNtks = nNtks;
    pNew->pNtks = ABC_CALLOC( Bac_Ntk_t, pNew->nNtks + 1 );
    Bac_ManForEachNtk( pNew, pNtk, i )
        pNtk->pDesign = pNew;
    Bac_ManSetupTypes( pNew->pPrimNames, pNew->pPrimSymbs );
    return pNew;
}